

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp_id_GostR3410_2001_CryptoPro_A_ParamSet.c
# Opt level: O2

void point_double(pt_prj_t_conflict4 *Q,pt_prj_t_conflict4 *P)

{
  uint64_t *out1;
  uint64_t *out1_00;
  uint64_t *out1_01;
  fe_t_conflict1 t2;
  fe_t_conflict1 t1;
  fe_t_conflict1 t0;
  fe_t_conflict1 t3;
  uint64_t local_178 [10];
  uint64_t local_128 [10];
  uint64_t local_d8 [10];
  uint64_t local_88 [11];
  
  out1 = Q->Y;
  out1_00 = Q->T;
  out1_01 = Q->Z;
  fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_square(local_d8,P->X);
  fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_square(local_128,P->Y);
  fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_square(local_178,P->Z);
  fiat_id_tc26_gost_3410_2012_512_paramSetC_add(local_88,local_178,local_178);
  fiat_id_tc26_gost_3410_2012_512_paramSetC_carry(local_88,local_88);
  fiat_id_tc26_gost_3410_2012_512_paramSetC_add(Q->X,P->X,P->Y);
  fiat_id_tc26_gost_3410_2012_512_paramSetC_carry(Q->X,Q->X);
  fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_square(out1,Q->X);
  fiat_id_tc26_gost_3410_2012_512_paramSetC_sub(out1_00,out1,local_d8);
  fiat_id_tc26_gost_3410_2012_512_paramSetC_carry(out1_00,out1_00);
  fiat_id_tc26_gost_3410_2012_512_paramSetC_sub(out1_01,out1_00,local_128);
  fiat_id_tc26_gost_3410_2012_512_paramSetC_carry(out1_01,out1_01);
  fiat_id_tc26_gost_3410_2012_512_paramSetC_add(out1,local_d8,local_128);
  fiat_id_tc26_gost_3410_2012_512_paramSetC_carry(out1,out1);
  fiat_id_tc26_gost_3410_2012_512_paramSetC_sub(local_178,out1,local_88);
  fiat_id_tc26_gost_3410_2012_512_paramSetC_carry(local_178,local_178);
  fiat_id_tc26_gost_3410_2012_512_paramSetC_sub(local_88,local_d8,local_128);
  fiat_id_tc26_gost_3410_2012_512_paramSetC_carry(local_88,local_88);
  fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_mul(Q->X,out1_01,local_178);
  fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_mul(out1_00,out1_01,local_88);
  fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_mul(out1_01,local_178,out1);
  fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_mul(out1,out1,local_88);
  return;
}

Assistant:

static void point_double(pt_prj_t *Q, const pt_prj_t *P) {
    /* temporary variables */
    fe_t t0, t1, t2, t3, t4;
    /* constants */
    const limb_t *b = const_b;
    /* set pointers for legacy curve arith */
    const limb_t *X = P->X;
    const limb_t *Y = P->Y;
    const limb_t *Z = P->Z;
    limb_t *X3 = Q->X;
    limb_t *Y3 = Q->Y;
    limb_t *Z3 = Q->Z;

    /* the curve arith formula */
    fiat_id_GostR3410_2001_CryptoPro_A_ParamSet_carry_square(t0, X);
    fiat_id_GostR3410_2001_CryptoPro_A_ParamSet_carry_square(t1, Y);
    fiat_id_GostR3410_2001_CryptoPro_A_ParamSet_carry_square(t2, Z);
    fiat_id_GostR3410_2001_CryptoPro_A_ParamSet_carry_mul(t3, X, Y);
    fiat_id_GostR3410_2001_CryptoPro_A_ParamSet_carry_add(t3, t3, t3);
    fiat_id_GostR3410_2001_CryptoPro_A_ParamSet_carry_mul(t4, Y, Z);
    fiat_id_GostR3410_2001_CryptoPro_A_ParamSet_carry_mul(Z3, X, Z);
    fiat_id_GostR3410_2001_CryptoPro_A_ParamSet_carry_add(Z3, Z3, Z3);
    fiat_id_GostR3410_2001_CryptoPro_A_ParamSet_carry_mul(Y3, b, t2);
    fiat_id_GostR3410_2001_CryptoPro_A_ParamSet_carry_sub(Y3, Y3, Z3);
    fiat_id_GostR3410_2001_CryptoPro_A_ParamSet_carry_add(X3, Y3, Y3);
    fiat_id_GostR3410_2001_CryptoPro_A_ParamSet_carry_add(Y3, X3, Y3);
    fiat_id_GostR3410_2001_CryptoPro_A_ParamSet_carry_sub(X3, t1, Y3);
    fiat_id_GostR3410_2001_CryptoPro_A_ParamSet_carry_add(Y3, t1, Y3);
    fiat_id_GostR3410_2001_CryptoPro_A_ParamSet_carry_mul(Y3, X3, Y3);
    fiat_id_GostR3410_2001_CryptoPro_A_ParamSet_carry_mul(X3, X3, t3);
    fiat_id_GostR3410_2001_CryptoPro_A_ParamSet_carry_add(t3, t2, t2);
    fiat_id_GostR3410_2001_CryptoPro_A_ParamSet_carry_add(t2, t2, t3);
    fiat_id_GostR3410_2001_CryptoPro_A_ParamSet_carry_mul(Z3, b, Z3);
    fiat_id_GostR3410_2001_CryptoPro_A_ParamSet_carry_sub(Z3, Z3, t2);
    fiat_id_GostR3410_2001_CryptoPro_A_ParamSet_carry_sub(Z3, Z3, t0);
    fiat_id_GostR3410_2001_CryptoPro_A_ParamSet_carry_add(t3, Z3, Z3);
    fiat_id_GostR3410_2001_CryptoPro_A_ParamSet_carry_add(Z3, Z3, t3);
    fiat_id_GostR3410_2001_CryptoPro_A_ParamSet_carry_add(t3, t0, t0);
    fiat_id_GostR3410_2001_CryptoPro_A_ParamSet_carry_add(t0, t3, t0);
    fiat_id_GostR3410_2001_CryptoPro_A_ParamSet_carry_sub(t0, t0, t2);
    fiat_id_GostR3410_2001_CryptoPro_A_ParamSet_carry_mul(t0, t0, Z3);
    fiat_id_GostR3410_2001_CryptoPro_A_ParamSet_carry_add(Y3, Y3, t0);
    fiat_id_GostR3410_2001_CryptoPro_A_ParamSet_carry_add(t0, t4, t4);
    fiat_id_GostR3410_2001_CryptoPro_A_ParamSet_carry_mul(Z3, t0, Z3);
    fiat_id_GostR3410_2001_CryptoPro_A_ParamSet_carry_sub(X3, X3, Z3);
    fiat_id_GostR3410_2001_CryptoPro_A_ParamSet_carry_mul(Z3, t0, t1);
    fiat_id_GostR3410_2001_CryptoPro_A_ParamSet_carry_add(Z3, Z3, Z3);
    fiat_id_GostR3410_2001_CryptoPro_A_ParamSet_carry_add(Z3, Z3, Z3);
}